

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O3

ssize_t __thiscall
UDPSplitPacketReader::recv(UDPSplitPacketReader *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  string *__return_storage_ptr__;
  undefined4 in_register_00000034;
  
  sVar1 = ::recv(this->socket,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0);
  if (-1 < (int)sVar1) {
    return sVar1;
  }
  __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
  sock_error_string_abi_cxx11_(__return_storage_ptr__,"UDPSplitPacketReader::recv()");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int UDPSplitPacketReader::recv(void *data, int length) {
  while (true) {
    if ((length = ::recv(socket, (char *)data, length, 0)) < 0) {
      throw sock_error_string("UDPSplitPacketReader::recv()");
    } else {
      break;
    }
  }
  return length;
}